

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O0

void print_bits(uint8_t bits,char **str_array)

{
  int local_1c;
  int i;
  char **str_array_local;
  uint8_t bits_local;
  
  local_1c = 0;
  for (str_array_local._7_1_ = bits; str_array_local._7_1_ != 0;
      str_array_local._7_1_ = (byte)((int)(uint)str_array_local._7_1_ >> 1)) {
    if ((str_array_local._7_1_ & 1) != 0) {
      printf("%s | ",str_array[local_1c]);
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void print_bits(uint8_t bits, char *str_array[]) {
    int i = 0;

    while (bits) {
        if (bits & 1) {
            printf("%s | ", str_array[i]);
        }
        bits >>= 1;
        i++;
    }
}